

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

CommandLineFlagParser * __thiscall
google::anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
          (CommandLineFlagParser *this,string *flagval,FlagSettingMode set_mode,
          bool errors_are_fatal)

{
  CommandLineFlag *pCVar1;
  bool bVar2;
  FlagSettingMode set_mode_00;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  byte in_R8B;
  CommandLineFlagParser local_260 [39];
  allocator local_239;
  string local_238 [32];
  string local_218 [32];
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  string local_168 [8];
  string envval;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [8];
  string envname;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  CommandLineFlag *local_68;
  CommandLineFlag *flag;
  char *flagname;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flaglist;
  allocator local_26;
  byte local_25;
  undefined4 local_24;
  bool errors_are_fatal_local;
  undefined8 uStack_20;
  FlagSettingMode set_mode_local;
  string *flagval_local;
  CommandLineFlagParser *this_local;
  string *msg;
  
  uStack_20 = CONCAT44(in_register_00000014,set_mode);
  local_24 = (undefined4)CONCAT71(in_register_00000009,errors_are_fatal);
  local_25 = in_R8B & 1;
  flagval_local = flagval;
  this_local = this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    flaglist.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    std::__cxx11::string::string((string *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ParseFlagList(pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i);
    for (flagname = (char *)0x0; pcVar4 = flagname,
        pcVar5 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&i), pcVar4 < pcVar5; flagname = flagname + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i,(size_type)flagname);
      flag = (CommandLineFlag *)std::__cxx11::string::c_str();
      local_68 = FlagRegistry::FindFlagLocked(*(FlagRegistry **)flagval,(char *)flag);
      if (local_68 == (CommandLineFlag *)0x0) {
        StringPrintf_abi_cxx11_
                  ((char *)local_88,
                   "%sunknown command line flag \'%s\' (via --fromenv or --tryfromenv)\n","ERROR: ",
                   flag);
        pCVar1 = flag;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,(char *)pCVar1,&local_a9);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(flagval + 8),(key_type *)local_a8);
        std::__cxx11::string::operator=((string *)pmVar6,local_88);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        std::__cxx11::string::~string(local_88);
        pCVar1 = flag;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,(char *)pCVar1,&local_d1);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(flagval + 0x38),(key_type *)local_d0);
        std::__cxx11::string::operator=((string *)pmVar6,"");
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,"FLAGS_",&local_119);
        pCVar1 = flag;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,(char *)pCVar1,&local_141);
        std::operator+(local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_118);
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        std::__cxx11::string::string(local_168);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar2 = SafeGetEnv(pcVar4,(string *)local_168);
        if (bVar2) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_168,"fromenv");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_168,"tryfromenv"), pCVar1 = local_68, bVar2)) {
            uVar7 = std::__cxx11::string::c_str();
            StringPrintf_abi_cxx11_
                      ((char *)local_218,"%sinfinite recursion on environment flag \'%s\'\n",
                       "ERROR: ",uVar7);
            pCVar1 = flag;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_238,(char *)pCVar1,&local_239);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)(flagval + 8),(key_type *)local_238);
            std::__cxx11::string::operator=((string *)pmVar6,local_218);
            std::__cxx11::string::~string(local_238);
            std::allocator<char>::~allocator((allocator<char> *)&local_239);
            std::__cxx11::string::~string(local_218);
            local_1f8 = 4;
          }
          else {
            set_mode_00 = std::__cxx11::string::c_str();
            (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                      (local_260,(CommandLineFlag *)flagval,(char *)pCVar1,set_mode_00);
            std::__cxx11::string::operator+=((string *)this,(string *)local_260);
            std::__cxx11::string::~string((string *)local_260);
            local_1f8 = 0;
          }
        }
        else {
          if ((local_25 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1c8,"ERROR: ",&local_1c9);
            std::operator+(local_1a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8);
            std::operator+(local_188,(char *)local_1a8);
            pCVar1 = flag;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1f0,(char *)pCVar1,&local_1f1);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)(flagval + 8),(key_type *)local_1f0);
            std::__cxx11::string::operator=((string *)pmVar6,(string *)local_188);
            std::__cxx11::string::~string(local_1f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
            std::__cxx11::string::~string((string *)local_188);
            std::__cxx11::string::~string((string *)local_1a8);
            std::__cxx11::string::~string(local_1c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
          }
          local_1f8 = 4;
        }
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::~string((string *)local_f8);
      }
    }
    flaglist.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    local_1f8 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    if ((flaglist.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)this);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return this;
}

Assistant:

string CommandLineFlagParser::ProcessFromenvLocked(const string& flagval,
                                                   FlagSettingMode set_mode,
                                                   bool errors_are_fatal) {
  if (flagval.empty())
    return "";

  string msg;
  vector<string> flaglist;
  ParseFlagList(flagval.c_str(), &flaglist);

  for (size_t i = 0; i < flaglist.size(); ++i) {
    const char* flagname = flaglist[i].c_str();
    CommandLineFlag* flag = registry_->FindFlagLocked(flagname);
    if (flag == NULL) {
      error_flags_[flagname] =
          StringPrintf("%sunknown command line flag '%s' "
                       "(via --fromenv or --tryfromenv)\n",
                       kError, flagname);
      undefined_names_[flagname] = "";
      continue;
    }

    const string envname = string("FLAGS_") + string(flagname);
	string envval;
	if (!SafeGetEnv(envname.c_str(), envval)) {
      if (errors_are_fatal) {
        error_flags_[flagname] = (string(kError) + envname +
                                  " not found in environment\n");
      }
      continue;
    }

    // Avoid infinite recursion.
    if (envval == "fromenv" || envval == "tryfromenv") {
      error_flags_[flagname] =
          StringPrintf("%sinfinite recursion on environment flag '%s'\n",
                       kError, envval.c_str());
      continue;
    }

    msg += ProcessSingleOptionLocked(flag, envval.c_str(), set_mode);
  }
  return msg;
}